

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float ImGui::GetNavInputAmount(ImGuiNavInput n,ImGuiInputReadMode mode)

{
  float t1;
  int iVar1;
  float fVar2;
  float t0;
  float repeat_delay;
  
  if (mode == ImGuiInputReadMode_Down) {
    return (GImGui->IO).NavInputs[n];
  }
  t1 = (GImGui->IO).NavInputsDownDuration[n];
  if ((mode == ImGuiInputReadMode_Released) && (t1 < 0.0)) {
    return (float)(-(uint)(0.0 <= (GImGui->IO).NavInputsDownDurationPrev[n]) & 0x3f800000);
  }
  fVar2 = 0.0;
  if (t1 < 0.0) {
    return 0.0;
  }
  switch(mode) {
  case ImGuiInputReadMode_Pressed:
    return (float)(-(uint)(t1 == 0.0) & 0x3f800000);
  default:
    goto switchD_00138517_caseD_2;
  case ImGuiInputReadMode_Repeat:
    t0 = t1 - (GImGui->IO).DeltaTime;
    repeat_delay = (GImGui->IO).KeyRepeatDelay * 0.72;
    fVar2 = (GImGui->IO).KeyRepeatRate * 0.8;
    break;
  case ImGuiInputReadMode_RepeatSlow:
    t0 = t1 - (GImGui->IO).DeltaTime;
    fVar2 = (GImGui->IO).KeyRepeatRate;
    repeat_delay = (GImGui->IO).KeyRepeatDelay * 1.25;
    fVar2 = fVar2 + fVar2;
    break;
  case ImGuiInputReadMode_RepeatFast:
    t0 = t1 - (GImGui->IO).DeltaTime;
    repeat_delay = (GImGui->IO).KeyRepeatDelay * 0.72;
    fVar2 = (GImGui->IO).KeyRepeatRate * 0.3;
  }
  iVar1 = CalcTypematicRepeatAmount(t0,t1,repeat_delay,fVar2);
  fVar2 = (float)iVar1;
switchD_00138517_caseD_2:
  return fVar2;
}

Assistant:

float ImGui::GetNavInputAmount(ImGuiNavInput n, ImGuiInputReadMode mode)
{
    ImGuiContext& g = *GImGui;
    if (mode == ImGuiInputReadMode_Down)
        return g.IO.NavInputs[n];                         // Instant, read analog input (0.0f..1.0f, as provided by user)

    const float t = g.IO.NavInputsDownDuration[n];
    if (t < 0.0f && mode == ImGuiInputReadMode_Released)  // Return 1.0f when just released, no repeat, ignore analog input.
        return (g.IO.NavInputsDownDurationPrev[n] >= 0.0f ? 1.0f : 0.0f);
    if (t < 0.0f)
        return 0.0f;
    if (mode == ImGuiInputReadMode_Pressed)               // Return 1.0f when just pressed, no repeat, ignore analog input.
        return (t == 0.0f) ? 1.0f : 0.0f;
    if (mode == ImGuiInputReadMode_Repeat)
        return (float)CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay * 0.72f, g.IO.KeyRepeatRate * 0.80f);
    if (mode == ImGuiInputReadMode_RepeatSlow)
        return (float)CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay * 1.25f, g.IO.KeyRepeatRate * 2.00f);
    if (mode == ImGuiInputReadMode_RepeatFast)
        return (float)CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay * 0.72f, g.IO.KeyRepeatRate * 0.30f);
    return 0.0f;
}